

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O0

void gflags::anon_unknown_5::TestFlagString
               (string *flags,string *expected_string,bool expected_bool,int32 expected_int32,
               double expected_double)

{
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  double expected_double_local;
  int32 expected_int32_local;
  bool expected_bool_local;
  string *expected_string_local;
  string *flags_local;
  
  pcVar3 = GetArgv0();
  bVar1 = ReadFlagsFromString(flags,pcVar3,true);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","ReadFlagsFromString(flags, GetArgv0(), true)");
    exit(1);
  }
  _Var2 = std::operator==(expected_string,fLS::FLAGS_test_string_abi_cxx11_);
  if (!_Var2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_string","==","FLAGS_test_string");
    exit(1);
  }
  if (expected_bool != (bool)(fLB::FLAGS_test_bool & 1)) {
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_bool","==","FLAGS_test_bool");
    exit(1);
  }
  if (expected_int32 != fLI::FLAGS_test_int32) {
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_int32","==","FLAGS_test_int32");
    exit(1);
  }
  if (fLD::FLAGS_test_double - 0.001 <= expected_double) {
    if (expected_double <= fLD::FLAGS_test_double + 0.001) {
      return;
    }
  }
  fprintf(_stderr,"Check failed: %s == %s\n","expected_double","FLAGS_test_double");
  exit(1);
}

Assistant:

void TestFlagString(const string& flags,
                    const string& expected_string,
                    bool expected_bool,
                    int32 expected_int32,
                    double expected_double) {
  EXPECT_TRUE(ReadFlagsFromString(flags,
                                  GetArgv0(),
                                  // errors are fatal
                                  true));

  EXPECT_EQ(expected_string, FLAGS_test_string);
  EXPECT_EQ(expected_bool, FLAGS_test_bool);
  EXPECT_EQ(expected_int32, FLAGS_test_int32);
  EXPECT_DOUBLE_EQ(expected_double, FLAGS_test_double);
}